

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O1

void agent_free_identities(LIBSSH2_AGENT *agent)

{
  list_node *node;
  list_node *plVar1;
  
  node = (list_node *)_libssh2_list_first(&agent->head);
  while (node != (list_node *)0x0) {
    plVar1 = (list_node *)_libssh2_list_next(node);
    (*agent->session->free)(node[1].head,&agent->session->abstract);
    (*agent->session->free)(node[2].prev,&agent->session->abstract);
    (*agent->session->free)(node,&agent->session->abstract);
    node = plVar1;
  }
  _libssh2_list_init(&agent->head);
  return;
}

Assistant:

static void
agent_free_identities(LIBSSH2_AGENT *agent)
{
    struct agent_publickey *node;
    struct agent_publickey *next;

    for(node = _libssh2_list_first(&agent->head); node; node = next) {
        next = _libssh2_list_next(&node->node);
        LIBSSH2_FREE(agent->session, node->external.blob);
        LIBSSH2_FREE(agent->session, node->external.comment);
        LIBSSH2_FREE(agent->session, node);
    }
    _libssh2_list_init(&agent->head);
}